

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O3

void vkt::ssbo::anon_unknown_15::copyNonWrittenData
               (BufferLayout *layout,BufferBlock *block,int instanceNdx,BlockDataPtr *srcBlockPtr,
               BlockDataPtr *dstBlockPtr,BufferVar *bufVar,SubTypeAccess *accessPath)

{
  BufferVarLayoutEntry *dstEntry;
  BlockDataPtr *accessPath_00;
  undefined4 uVar1;
  int iVar2;
  int ndx;
  string apiName;
  VarType curType;
  SubTypeAccess local_78;
  VarType local_48;
  
  accessPath_00 = dstBlockPtr;
  glu::
  getVarType<__gnu_cxx::__normal_iterator<glu::VarTypeComponent_const*,std::vector<glu::VarTypeComponent,std::allocator<glu::VarTypeComponent>>>>
            (&local_48,(glu *)accessPath,
             (VarType *)
             (accessPath->m_path).
             super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (accessPath->m_path).
             super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>.
             _M_impl.super__Vector_impl_data._M_finish,
             (__normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
              )dstBlockPtr);
  if (local_48.m_type == TYPE_STRUCT) {
    iVar2 = (int)((ulong)((long)((local_48.m_data.structPtr)->m_members).
                                super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)((local_48.m_data.structPtr)->m_members).
                               super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249;
    if (0 < iVar2) {
      ndx = 0;
      do {
        glu::SubTypeAccess::member(&local_78,accessPath,ndx);
        copyNonWrittenData(layout,block,instanceNdx,srcBlockPtr,dstBlockPtr,bufVar,&local_78);
        if (local_78.m_path.
            super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_78.m_path.
                          super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_78.m_path.
                                super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_78.m_path.
                                super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        glu::VarType::~VarType(&local_78.m_type);
        ndx = ndx + 1;
      } while (iVar2 != ndx);
    }
  }
  else if (local_48.m_type == TYPE_ARRAY) {
    uVar1 = local_48.m_data.array.size;
    if (local_48.m_data.array.size == -1) {
      uVar1 = (block->m_lastUnsizedArraySizes).super__Vector_base<int,_std::allocator<int>_>._M_impl
              .super__Vector_impl_data._M_start[instanceNdx];
    }
    if (0 < (int)uVar1) {
      iVar2 = 0;
      do {
        glu::SubTypeAccess::element(&local_78,accessPath,iVar2);
        copyNonWrittenData(layout,block,instanceNdx,srcBlockPtr,dstBlockPtr,bufVar,&local_78);
        if (local_78.m_path.
            super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_78.m_path.
                          super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_78.m_path.
                                super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_78.m_path.
                                super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        glu::VarType::~VarType(&local_78.m_type);
        iVar2 = iVar2 + 1;
      } while (uVar1 != iVar2);
    }
  }
  else {
    ssbo::(anonymous_namespace)::getAPIName_abi_cxx11_
              ((string *)&local_78,(_anonymous_namespace_ *)block,(BufferBlock *)bufVar,
               (BufferVar *)&accessPath->m_path,(TypeComponentVector *)accessPath_00);
    iVar2 = BufferLayout::getVariableIndex(layout,(string *)&local_78);
    dstEntry = (layout->bufferVars).
               super__Vector_base<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
               ._M_impl.super__Vector_impl_data._M_start + iVar2;
    copyBufferVarData(dstEntry,dstBlockPtr,dstEntry,(BlockDataPtr *)srcBlockPtr->ptr);
    if ((undefined1 *)local_78.m_type._0_8_ != (undefined1 *)((long)&local_78 + 0x10U)) {
      operator_delete((void *)local_78.m_type._0_8_,local_78.m_type.m_data._8_8_ + 1);
    }
  }
  glu::VarType::~VarType(&local_48);
  return;
}

Assistant:

void copyNonWrittenData (
	const BufferLayout&			layout,
	const BufferBlock&			block,
	int							instanceNdx,
	const BlockDataPtr&			srcBlockPtr,
	const BlockDataPtr&			dstBlockPtr,
	const BufferVar&			bufVar,
	const glu::SubTypeAccess&	accessPath)
{
	const VarType curType = accessPath.getType();

	if (curType.isArrayType())
	{
		const int arraySize = curType.getArraySize() == VarType::UNSIZED_ARRAY ? block.getLastUnsizedArraySize(instanceNdx) : curType.getArraySize();

		for (int elemNdx = 0; elemNdx < arraySize; elemNdx++)
			copyNonWrittenData(layout, block, instanceNdx, srcBlockPtr, dstBlockPtr, bufVar, accessPath.element(elemNdx));
	}
	else if (curType.isStructType())
	{
		const int numMembers = curType.getStructPtr()->getNumMembers();

		for (int memberNdx = 0; memberNdx < numMembers; memberNdx++)
			copyNonWrittenData(layout, block, instanceNdx, srcBlockPtr, dstBlockPtr, bufVar, accessPath.member(memberNdx));
	}
	else
	{
		DE_ASSERT(curType.isBasicType());

		const string	apiName	= getAPIName(block, bufVar, accessPath.getPath());
		const int		varNdx	= layout.getVariableIndex(apiName);

		DE_ASSERT(varNdx >= 0);
		{
			const BufferVarLayoutEntry& varLayout = layout.bufferVars[varNdx];
			copyBufferVarData(varLayout, dstBlockPtr, varLayout, srcBlockPtr);
		}
	}
}